

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RDI;
  FilePath output_dir;
  FilePath output_file_path;
  FILE *fileout;
  char *in_stack_ffffffffffffff68;
  GTestLog *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  FilePath *in_stack_ffffffffffffff80;
  GTestLog local_60 [10];
  FilePath *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  GTestLogSeverity in_stack_ffffffffffffffec;
  FILE *pFVar3;
  
  pFVar3 = (FILE *)0x0;
  FilePath::FilePath(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  FilePath::RemoveFileName((FilePath *)in_RDI);
  bVar1 = FilePath::CreateDirectoriesRecursively(in_stack_ffffffffffffffc8);
  if (bVar1) {
    std::__cxx11::string::c_str();
    pFVar3 = posix::FOpen((char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  if (pFVar3 == (FILE *)0x0) {
    GTestLog::GTestLog((GTestLog *)0x0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,
                       in_stack_ffffffffffffffdc);
    poVar2 = GTestLog::GetStream(local_60);
    poVar2 = std::operator<<(poVar2,"Unable to open file \"");
    poVar2 = std::operator<<(poVar2,in_RDI);
    std::operator<<(poVar2,"\"");
    GTestLog::~GTestLog(in_stack_ffffffffffffff70);
  }
  FilePath::~FilePath((FilePath *)0x1714ea);
  FilePath::~FilePath((FilePath *)0x1714f4);
  return pFVar3;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = nullptr;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == nullptr) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}